

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

size_t effect_get_menu_name(char *buf,size_t max,effect *e)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  wchar_t wVar5;
  size_t sVar6;
  obj_property *poVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *fmt;
  bool bVar11;
  bool bVar12;
  random_value value;
  char dist [32];
  random_value local_58;
  char local_48 [32];
  
  if ((e == (effect *)0x0) || (uVar1 = e->index, (ushort)(uVar1 - 0x80) < 0xff81)) {
    return 0;
  }
  if (0x13 < (uint)base_descs[uVar1].efinfo_flag) {
    sVar6 = strnfmt(buf,max,"%s","");
    msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
    return sVar6;
  }
  fmt = base_descs[uVar1].menu_name;
  switch(base_descs[uVar1].efinfo_flag) {
  default:
    pcVar9 = fmt;
    fmt = "%s";
    break;
  case 4:
    bVar3 = true;
    switch(e->subtype) {
    case L'\0':
      pcVar9 = "yourself";
      pcVar10 = "feed";
      break;
    case L'\x01':
      pcVar9 = "hunger";
      pcVar10 = "increase";
      break;
    case L'\x02':
      if (e->dice == (dice_t *)0x0) {
        wVar5 = L'\0';
      }
      else {
        wVar5 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
      }
      pcVar10 = "become";
      if (wVar5 <= PY_FOOD_FULL) {
        bVar12 = SBORROW4(wVar5,PY_FOOD_HUNGRY);
        iVar2 = wVar5 - PY_FOOD_HUNGRY;
        bVar11 = wVar5 == PY_FOOD_HUNGRY;
        pcVar8 = "satisfied";
        goto LAB_00144a7c;
      }
LAB_00144a63:
      pcVar9 = "bloated";
      break;
    case L'\x03':
      if (e->dice == (dice_t *)0x0) {
        wVar5 = L'\0';
      }
      else {
        wVar5 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
      }
      pcVar10 = "leave";
      if (PY_FOOD_FULL < wVar5) goto LAB_00144a63;
      bVar12 = SBORROW4(wVar5,PY_FOOD_HUNGRY);
      iVar2 = wVar5 - PY_FOOD_HUNGRY;
      bVar11 = wVar5 == PY_FOOD_HUNGRY;
      pcVar8 = "nourished";
LAB_00144a7c:
      pcVar9 = "hungry";
      if (!bVar11 && bVar12 == iVar2 < 0) {
        pcVar9 = pcVar8;
      }
      break;
    default:
      bVar3 = false;
      pcVar10 = (char *)0x0;
      pcVar9 = (char *)0x0;
    }
    if (bVar3) {
      sVar6 = strnfmt(buf,max,fmt,pcVar10,pcVar9);
      return sVar6;
    }
    fmt = "%s";
    pcVar9 = "";
    break;
  case 5:
  case 6:
    pcVar9 = timed_effects[e->subtype].desc;
    break;
  case 7:
    poVar7 = lookup_obj_property(L'\x01',e->subtype);
    pcVar9 = poVar7->name;
    break;
  case 8:
  case 0x11:
  case 0x12:
  case 0x13:
    pcVar9 = projections[e->subtype].desc;
    break;
  case 9:
    pcVar9 = summon_desc(e->subtype);
    break;
  case 10:
    local_58.base = 0;
    local_58.dice = 0;
    local_58.sides = 0;
    local_58.m_bonus = 0;
    if (e->dice == (dice_t *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = dice_evaluate(e->dice,1,AVERAGE,&local_58);
    }
    if (local_58.m_bonus == 0) {
      strnfmt(local_48,0x20,"%d grids",(ulong)uVar4);
    }
    else {
      strnfmt(local_48,0x20,"some distance");
    }
    pcVar9 = "other";
    if (e->subtype == L'\0') {
      pcVar9 = "you";
    }
    sVar6 = strnfmt(buf,max,fmt,pcVar9,local_48);
    return sVar6;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pcVar9 = projections[e->subtype].player_desc;
    break;
  case 0x10:
    pcVar9 = projections[e->subtype].lash_desc;
  }
  sVar6 = strnfmt(buf,max,fmt,pcVar9);
  return sVar6;
}

Assistant:

size_t effect_get_menu_name(char *buf, size_t max, const struct effect *e)
{
	const char *fmt;
	size_t len;

	if (!e || e->index <= EF_NONE || e->index >= EF_MAX) {
		return 0;
	}

	fmt = base_descs[e->index].menu_name;
	switch (base_descs[e->index].efinfo_flag) {
	case EFINFO_DICE:
	case EFINFO_HEAL:
	case EFINFO_CONST:
	case EFINFO_QUAKE:
	case EFINFO_NONE:
		len = strnfmt(buf, max, "%s", fmt);
		break;

	case EFINFO_FOOD:
		{
			const char *actstr;
			const char *actarg;
			int avg;

			switch (e->subtype) {
			case 0: /* INC_BY */
				actstr = "feed";
				actarg = "yourself";
				break;
			case 1: /* DEC_BY */
				actstr = "increase";
				actarg = "hunger";
				break;
			case 2: /* SET_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL) : 0;
				actstr = "become";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "satisfied";
				} else {
					actarg = "hungry";
				}
				break;
			case 3: /* INC_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL): 0;
				actstr = "leave";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "nourished";
				} else {
					actarg = "hungry";
				}
				break;
			default:
				actstr = NULL;
				actarg = NULL;
				break;
			}
			if (actstr && actarg) {
				len = strnfmt(buf, max, fmt, actstr, actarg);
			} else {
				len = strnfmt(buf, max, "%s", "");
			}
		}
		break;

	case EFINFO_CURE:
	case EFINFO_TIMED:
		len = strnfmt(buf, max, fmt, timed_effects[e->subtype].desc);
		break;

	case EFINFO_STAT:
		len = strnfmt(buf, max, fmt,
			lookup_obj_property(OBJ_PROPERTY_STAT,
			e->subtype)->name);
		break;

	case EFINFO_SEEN:
	case EFINFO_BOLT:
	case EFINFO_BOLTD:
	case EFINFO_TOUCH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].desc);
		break;

	case EFINFO_SUMM:
		len = strnfmt(buf, max, fmt, summon_desc(e->subtype));
		break;

	case EFINFO_TELE:
		{
			random_value value = { 0, 0, 0, 0 };
			char dist[32];
			int avg = 0;

			if (e->dice) {
				avg = dice_evaluate(e->dice, 1, AVERAGE,
					&value);
			}
			if (value.m_bonus) {
				strnfmt(dist, sizeof(dist), "some distance");
			} else {
				strnfmt(dist, sizeof(dist), "%d grids", avg);
			}
			len = strnfmt(buf, max, fmt,
				(e->subtype) ? "other" : "you", dist);
		}
		break;

	case EFINFO_BALL:
	case EFINFO_SPOT:
	case EFINFO_BREATH:
	case EFINFO_SHORT:
		len = strnfmt(buf, max, fmt,
			projections[e->subtype].player_desc);
		break;

	case EFINFO_LASH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].lash_desc);
		break;

	default:
		len = strnfmt(buf, max, "%s", "");
		msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
		break;
	}

	return len;
}